

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int populate_languages_metadata(MMDB_s *mmdb,MMDB_s *metadata_db,MMDB_entry_s *metadata_start)

{
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  MMDB_entry_data_list_s *pMVar6;
  uint uVar7;
  MMDB_entry_data_list_s *pMVar8;
  bool bVar9;
  MMDB_entry_data_s entry_data;
  MMDB_entry_s array_start;
  MMDB_entry_data_list_s *local_88;
  MMDB_entry_data_list_s *local_80;
  MMDB_entry_data_s local_78;
  MMDB_entry_s local_40;
  
  uVar1 = MMDB_aget_value(metadata_start,&local_78,&PTR_anon_var_dwarf_1bfb_00108db0);
  if ((uVar1 == 0) && (uVar1 = 3, local_78.type == 0xb)) {
    local_40.offset = local_78.offset;
    local_40.mmdb = metadata_db;
    uVar1 = MMDB_get_entry_data_list(&local_40,&local_88);
    pMVar8 = local_88;
    uVar5 = (ulong)uVar1;
    if (uVar1 == 0) {
      uVar1 = (local_88->entry_data).data_size;
      (mmdb->metadata).languages.count = 0;
      ppcVar2 = (char **)calloc((ulong)uVar1,8);
      (mmdb->metadata).languages.names = ppcVar2;
      if (ppcVar2 == (char **)0x0) {
        uVar1 = 5;
      }
      else {
        local_80 = pMVar8;
        bVar9 = uVar1 != 0;
        pMVar6 = local_88;
        if (bVar9) {
          uVar5 = 1;
          uVar7 = uVar1;
          do {
            pMVar6 = pMVar6->next;
            if ((pMVar6->entry_data).type != 2) {
              iVar4 = 3;
LAB_001050c2:
              pMVar8 = local_80;
              local_88 = pMVar6;
              if (local_80 != (MMDB_entry_data_list_s *)0x0) {
                data_pool_destroy((MMDB_data_pool_s *)local_80->pool);
              }
              goto LAB_001050d5;
            }
            pcVar3 = mmdb_strndup((pMVar6->entry_data).field_1.utf8_string,
                                  (ulong)(pMVar6->entry_data).data_size);
            (mmdb->metadata).languages.names[uVar5 - 1] = pcVar3;
            if ((mmdb->metadata).languages.names[uVar5 - 1] == (char *)0x0) {
              iVar4 = 5;
              goto LAB_001050c2;
            }
            (mmdb->metadata).languages.count = uVar5;
            bVar9 = (uint)uVar5 < uVar1;
            uVar5 = uVar5 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        iVar4 = (int)uVar5;
        pMVar8 = local_80;
        local_88 = pMVar6;
LAB_001050d5:
        if (bVar9) {
          return iVar4;
        }
        uVar1 = 0;
      }
      if (pMVar8 != (MMDB_entry_data_list_s *)0x0) {
        data_pool_destroy((MMDB_data_pool_s *)pMVar8->pool);
      }
    }
  }
  return uVar1;
}

Assistant:

static int populate_languages_metadata(MMDB_s *mmdb,
                                       MMDB_s *metadata_db,
                                       MMDB_entry_s *metadata_start) {
    MMDB_entry_data_s entry_data;

    const char *path[] = {"languages", NULL};
    int status = MMDB_aget_value(metadata_start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (MMDB_DATA_TYPE_ARRAY != entry_data.type) {
        return MMDB_INVALID_METADATA_ERROR;
    }

    MMDB_entry_s array_start = {.mmdb = metadata_db,
                                .offset = entry_data.offset};

    MMDB_entry_data_list_s *member;
    status = MMDB_get_entry_data_list(&array_start, &member);
    if (MMDB_SUCCESS != status) {
        return status;
    }

    MMDB_entry_data_list_s *first_member = member;

    uint32_t array_size = member->entry_data.data_size;
    MAYBE_CHECK_SIZE_OVERFLOW(
        array_size, SIZE_MAX / sizeof(char *), MMDB_INVALID_METADATA_ERROR);

    mmdb->metadata.languages.count = 0;
    mmdb->metadata.languages.names = calloc(array_size, sizeof(char *));
    if (NULL == mmdb->metadata.languages.names) {
        MMDB_free_entry_data_list(first_member);
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    for (uint32_t i = 0; i < array_size; i++) {
        member = member->next;
        if (MMDB_DATA_TYPE_UTF8_STRING != member->entry_data.type) {
            MMDB_free_entry_data_list(first_member);
            return MMDB_INVALID_METADATA_ERROR;
        }

        mmdb->metadata.languages.names[i] = mmdb_strndup(
            member->entry_data.utf8_string, member->entry_data.data_size);

        if (NULL == mmdb->metadata.languages.names[i]) {
            MMDB_free_entry_data_list(first_member);
            return MMDB_OUT_OF_MEMORY_ERROR;
        }
        // We assign this as we go so that if we fail a calloc and need to
        // free it, the count is right.
        mmdb->metadata.languages.count = i + 1;
    }

    MMDB_free_entry_data_list(first_member);

    return MMDB_SUCCESS;
}